

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O3

void Res_SimSetRandomBytes(Res_Sim_t *p)

{
  uint *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  ulong uVar6;
  
  pVVar4 = p->pAig->vPis;
  if (0 < pVVar4->nSize) {
    lVar5 = 0;
    do {
      iVar1 = *(int *)((long)pVVar4->pArray[lVar5] + 0x10);
      if (((long)iVar1 < 0) || (p->vPats->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      p_00 = (uint *)p->vPats->pArray[iVar1];
      uVar3 = p->nWordsIn;
      if (lVar5 < p->nTruePis) {
        Abc_InfoRandomBytes(p_00,uVar3);
      }
      else if (0 < (int)uVar3) {
        uVar6 = (ulong)uVar3 + 1;
        do {
          iVar1 = rand();
          iVar2 = rand();
          uVar3 = rand();
          p_00[uVar6 - 2] = uVar3 ^ iVar2 << 0xc ^ iVar1 << 0x18;
          uVar6 = uVar6 - 1;
        } while (1 < uVar6);
      }
      lVar5 = lVar5 + 1;
      pVVar4 = p->pAig->vPis;
    } while (lVar5 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Res_SimSetRandomBytes( Res_Sim_t * p )
{
    Abc_Obj_t * pObj;
    unsigned * pInfo;
    int i;
    Abc_NtkForEachPi( p->pAig, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( p->vPats, pObj->Id );
        if ( i < p->nTruePis )
            Abc_InfoRandomBytes( pInfo, p->nWordsIn );
        else
            Abc_InfoRandom( pInfo, p->nWordsIn );
    }
/*
    // double-check that all are byte-patterns
    Abc_NtkForEachPi( p->pAig, pObj, i )
    {
        if ( i == p->nTruePis )
            break;
        pInfoC = (unsigned char *)Vec_PtrEntry( p->vPats, pObj->Id );
        for ( k = 0; k < p->nBytesIn; k++ )
            assert( pInfoC[k] == 0 || pInfoC[k] == 0xff );
    }
*/
}